

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::HostAddress::HostAddress(HostAddress *this,uint8_t *ip6Address)

{
  uint8_t *in_RDI;
  HostAddress *in_stack_ffffffffffffffe0;
  
  in_RDI[0] = 0xff;
  in_RDI[1] = 0xff;
  in_RDI[2] = 0xff;
  in_RDI[3] = 0xff;
  in_RDI[4] = '\0';
  in_RDI[5] = '\0';
  in_RDI[6] = '\0';
  in_RDI[7] = '\0';
  IPv6Address::IPv6Address((IPv6Address *)0x1d67fe);
  std::__cxx11::string::string((string *)(in_RDI + 0x18));
  in_RDI[0x38] = '\x01';
  SetAddress(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

HostAddress::HostAddress(const uint8_t* ip6Address)
    : m_protocol(HostAddress::UnknownNetworkProtocol)
    , m_ip4Address(0)
    , m_hasIpAddress(true)
{
    SetAddress(ip6Address);
}